

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O2

string * __thiscall
ser::Savepoint::ToString_abi_cxx11_(string *__return_storage_ptr__,Savepoint *this)

{
  ostream *poVar1;
  ostringstream ss;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,(string *)this);
  MetainfoSet::ToString_abi_cxx11_(&local_1b0,&this->metainfo_);
  std::operator<<(poVar1,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Savepoint::ToString() const
{
    std::ostringstream ss;
    ss << name_ << metainfo_.ToString();
    return ss.str();
}